

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O0

int __thiscall mp::SOLHandler_Easy::NItemsMax(SOLHandler_Easy *this,int kind)

{
  uint uVar1;
  int kind_local;
  SOLHandler_Easy *this_local;
  int local_4;
  
  uVar1 = kind & 3;
  if (uVar1 == 0) {
    local_4 = (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_vars;
  }
  else if (uVar1 == 1) {
    local_4 = (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons +
              (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_logical_cons;
  }
  else if (uVar1 == 2) {
    local_4 = (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_objs;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int NItemsMax(int kind) const {
    switch (kind & 3) {    // Without the Float bit
    case 0: return header_.num_vars;
    case 1: return
          header_.num_algebraic_cons
          + header_.num_logical_cons;
    case 2: return header_.num_objs;
    default: return 1;
    }
  }